

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O2

float __thiscall deqp::gls::DrawTest::getColorScale(DrawTest *this,DrawTestSpec *spec)

{
  bool bVar1;
  InputType type;
  uint uVar2;
  pointer pAVar3;
  long lVar4;
  int arrayNdx;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  GLValue GVar9;
  GLValue local_40;
  
  fVar8 = 1.0;
  lVar4 = 0x28;
  for (lVar5 = 1;
      pAVar3 = (spec->attribs).
               super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar5 < (int)(((long)(spec->attribs).
                           super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar3) / 0x28);
      lVar5 = lVar5 + 1) {
    if (((&pAVar3->additionalPositionAttribute)[lVar4] & 1U) == 0) {
      type = *(InputType *)((long)&pAVar3->inputType + lVar4);
      bVar1 = (&pAVar3->normalize)[lVar4];
      if (type == INPUTTYPE_INT_2_10_10_10) {
        if ((bVar1 & 1U) == 0) {
          fVar8 = fVar8 * 0.001953125;
        }
      }
      else if (type == INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
        if ((bVar1 & 1U) == 0) {
          fVar8 = fVar8 * 0.0009765625;
        }
      }
      else {
        uVar2 = *(uint *)((long)&pAVar3->outputType + lVar4);
        GVar9 = anon_unknown_1::GLValue::getMaxValue(type);
        local_40.field_1 = GVar9.field_1;
        local_40.type = GVar9.type;
        fVar6 = anon_unknown_1::GLValue::toFloat(&local_40);
        if (((bVar1 & 1U) == 0) ||
           ((fVar7 = 1.0, type < INPUTTYPE_UNSIGNED_INT_2_10_10_10 &&
            (fVar7 = 1.0, (0x207U >> (type & 0x1f) & 1) != 0)))) {
          fVar7 = 1.0 / fVar6;
        }
        fVar8 = fVar8 * fVar7;
        if ((uVar2 < 0xc) && ((0x908U >> (uVar2 & 0x1f) & 1) != 0)) {
          if (((bVar1 & 1U) == 0) ||
             ((fVar7 = 1.0, type < INPUTTYPE_UNSIGNED_INT_2_10_10_10 &&
              (fVar7 = 1.0, (0x207U >> (type & 0x1f) & 1) != 0)))) {
            fVar7 = 1.0 / fVar6;
          }
          fVar8 = fVar8 * fVar7;
        }
      }
    }
    lVar4 = lVar4 + 0x28;
  }
  return fVar8;
}

Assistant:

float DrawTest::getColorScale (const DrawTestSpec& spec) const
{
	float colorScale = 1.0f;

	for (int arrayNdx = 1; arrayNdx < (int)spec.attribs.size(); arrayNdx++)
	{
		DrawTestSpec::AttributeSpec attribSpec		= spec.attribs[arrayNdx];
		const bool					isPositionAttr	= (arrayNdx == 0) || (attribSpec.additionalPositionAttribute);

		if (isPositionAttr)
			continue;

		if (attribSpec.inputType == DrawTestSpec::INPUTTYPE_UNSIGNED_INT_2_10_10_10)
		{
			if (!attribSpec.normalize)
				colorScale *= 1.0f / 1024.0f;
		}
		else if (attribSpec.inputType == DrawTestSpec::INPUTTYPE_INT_2_10_10_10)
		{
			if (!attribSpec.normalize)
				colorScale *= 1.0f / 512.0f;
		}
		else
		{
			const float max = GLValue::getMaxValue(attribSpec.inputType).toFloat();

			colorScale *= (attribSpec.normalize && !inputTypeIsFloatType(attribSpec.inputType) ? 1.0f : float(1.0 / double(max)));
			if (attribSpec.outputType == DrawTestSpec::OUTPUTTYPE_VEC4 ||
				attribSpec.outputType == DrawTestSpec::OUTPUTTYPE_UVEC4 ||
				attribSpec.outputType == DrawTestSpec::OUTPUTTYPE_IVEC4)
				colorScale *= (attribSpec.normalize && !inputTypeIsFloatType(attribSpec.inputType) ? 1.0f : float(1.0 / double(max)));
		}
	}

	return colorScale;
}